

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O0

void png_handle_IHDR(png_structrp png_ptr,png_inforp info_ptr,png_uint_32 length)

{
  png_uint_32 width_00;
  png_uint_32 height_00;
  ulong local_60;
  int interlace_type;
  int filter_type;
  int compression_type;
  int color_type;
  int bit_depth;
  png_uint_32 height;
  png_uint_32 width;
  png_byte buf [13];
  png_uint_32 length_local;
  png_inforp info_ptr_local;
  png_structrp png_ptr_local;
  
  buf._5_4_ = length;
  unique0x100001e3 = info_ptr;
  if ((png_ptr->mode & 1) != 0) {
    png_chunk_error(png_ptr,"out of place");
  }
  if (length == 0xd) {
    png_ptr->mode = png_ptr->mode | 1;
    png_crc_read(png_ptr,(png_bytep)((long)&height + 3),0xd);
    png_crc_finish(png_ptr,0);
    width_00 = png_get_uint_31(png_ptr,(png_bytep)((long)&height + 3));
    height_00 = png_get_uint_31(png_ptr,(png_const_bytep)((long)&width + 3));
    png_ptr->width = width_00;
    png_ptr->height = height_00;
    png_ptr->bit_depth = buf[0];
    png_ptr->interlaced = buf[4];
    png_ptr->color_type = buf[1];
    png_ptr->filter_type = buf[3];
    png_ptr->compression_type = buf[2];
    switch(png_ptr->color_type) {
    default:
    case '\0':
    case '\x03':
      png_ptr->channels = '\x01';
      break;
    case '\x02':
      png_ptr->channels = '\x03';
      break;
    case '\x04':
      png_ptr->channels = '\x02';
      break;
    case '\x06':
      png_ptr->channels = '\x04';
    }
    png_ptr->pixel_depth = png_ptr->bit_depth * png_ptr->channels;
    if (png_ptr->pixel_depth < 8) {
      local_60 = (ulong)png_ptr->width * (ulong)png_ptr->pixel_depth + 7 >> 3;
    }
    else {
      local_60 = (ulong)png_ptr->width * (ulong)(png_ptr->pixel_depth >> 3);
    }
    png_ptr->rowbytes = local_60;
    png_set_IHDR(png_ptr,stack0xffffffffffffffe8,width_00,height_00,(uint)buf[0],(uint)buf[1],
                 (uint)buf[4],(uint)buf[2],(uint)buf[3]);
    return;
  }
  png_chunk_error(png_ptr,"invalid");
}

Assistant:

void /* PRIVATE */
png_handle_IHDR(png_structrp png_ptr, png_inforp info_ptr, png_uint_32 length)
{
   png_byte buf[13];
   png_uint_32 width, height;
   int bit_depth, color_type, compression_type, filter_type;
   int interlace_type;

   png_debug(1, "in png_handle_IHDR");

   if ((png_ptr->mode & PNG_HAVE_IHDR) != 0)
      png_chunk_error(png_ptr, "out of place");

   /* Check the length */
   if (length != 13)
      png_chunk_error(png_ptr, "invalid");

   png_ptr->mode |= PNG_HAVE_IHDR;

   png_crc_read(png_ptr, buf, 13);
   png_crc_finish(png_ptr, 0);

   width = png_get_uint_31(png_ptr, buf);
   height = png_get_uint_31(png_ptr, buf + 4);
   bit_depth = buf[8];
   color_type = buf[9];
   compression_type = buf[10];
   filter_type = buf[11];
   interlace_type = buf[12];

   /* Set internal variables */
   png_ptr->width = width;
   png_ptr->height = height;
   png_ptr->bit_depth = (png_byte)bit_depth;
   png_ptr->interlaced = (png_byte)interlace_type;
   png_ptr->color_type = (png_byte)color_type;
#ifdef PNG_MNG_FEATURES_SUPPORTED
   png_ptr->filter_type = (png_byte)filter_type;
#endif
   png_ptr->compression_type = (png_byte)compression_type;

   /* Find number of channels */
   switch (png_ptr->color_type)
   {
      default: /* invalid, png_set_IHDR calls png_error */
      case PNG_COLOR_TYPE_GRAY:
      case PNG_COLOR_TYPE_PALETTE:
         png_ptr->channels = 1;
         break;

      case PNG_COLOR_TYPE_RGB:
         png_ptr->channels = 3;
         break;

      case PNG_COLOR_TYPE_GRAY_ALPHA:
         png_ptr->channels = 2;
         break;

      case PNG_COLOR_TYPE_RGB_ALPHA:
         png_ptr->channels = 4;
         break;
   }

   /* Set up other useful info */
   png_ptr->pixel_depth = (png_byte)(png_ptr->bit_depth * png_ptr->channels);
   png_ptr->rowbytes = PNG_ROWBYTES(png_ptr->pixel_depth, png_ptr->width);
   png_debug1(3, "bit_depth = %d", png_ptr->bit_depth);
   png_debug1(3, "channels = %d", png_ptr->channels);
   png_debug1(3, "rowbytes = %lu", (unsigned long)png_ptr->rowbytes);
   png_set_IHDR(png_ptr, info_ptr, width, height, bit_depth,
       color_type, interlace_type, compression_type, filter_type);
}